

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

bool __thiscall
AbstractModuleClient::sendStimulationStartGroup(AbstractModuleClient *this,uint16_t group)

{
  bool bVar1;
  undefined2 in_SI;
  MlmWrap *in_RDI;
  TrodesMsg m;
  undefined6 in_stack_00000078;
  TrodesMsg *in_stack_ffffffffffffffa0;
  string local_58 [72];
  undefined6 in_stack_fffffffffffffff0;
  MlmWrap *this_00;
  
  this_00 = in_RDI;
  TrodesMsg::TrodesMsg(in_stack_ffffffffffffffa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"ss2",(allocator *)&stack0xffffffffffffffa7);
  TrodesMsg::addcontents<char_const*,char_const*,unsigned_short>
            ((TrodesMsg *)this,(string *)CONCAT26(group,in_stack_00000078),(char *)m.msg,
             (char *)m.format.field_2._8_8_,m.format.field_2._M_allocated_capacity._6_2_);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
  bVar1 = MlmWrap::sendHardwareMessage
                    (this_00,(TrodesMsg *)CONCAT26(in_SI,in_stack_fffffffffffffff0));
  TrodesMsg::~TrodesMsg((TrodesMsg *)in_RDI);
  return bVar1;
}

Assistant:

bool AbstractModuleClient::sendStimulationStartGroup(uint16_t group){
    TrodesMsg m;
    m.addcontents("ss2", "START", "GROUP", group);
    return sendHardwareMessage(m);
}